

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  secp256k1_modinv32_signed30 *psVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int32_t *piVar12;
  secp256k1_modinv32_signed30 *b;
  ulong uVar13;
  long *extraout_RDX;
  secp256k1_modinv32_signed30 *psVar14;
  long lVar15;
  ulong uVar16;
  uint64_t uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  secp256k1_fe *psVar21;
  ulong uVar22;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *a_00;
  long lVar23;
  ulong uVar24;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar25;
  uchar *__s;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  secp256k1_modinv32_modinfo *psVar32;
  ulong uVar33;
  uint uVar34;
  secp256k1_modinv32_modinfo *psVar35;
  uint64_t uVar36;
  size_t count;
  uint64_t uVar37;
  secp256k1_fe *a_01;
  uint uVar38;
  uint64_t uVar39;
  code *pcVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uStack_12d8;
  secp256k1_fe *psStack_12d0;
  uchar auStack_12c8 [4232];
  secp256k1_fe *psStack_240;
  ulong uStack_238;
  uint64_t uStack_230;
  secp256k1_fe *psStack_228;
  code *pcStack_220;
  code *pcStack_218;
  undefined1 auStack_210 [36];
  int iStack_1ec;
  int iStack_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  undefined1 auStack_1d0 [48];
  code *pcStack_1a0;
  long lStack_190;
  secp256k1_fe sStack_188;
  secp256k1_fe *psStack_150;
  secp256k1_fe sStack_148;
  secp256k1_fe sStack_118;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_modinv32_signed30 *psStack_c8;
  ulong uStack_c0;
  code *pcStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  secp256k1_modinv32_signed30 *psStack_98;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  int32_t iStack_7c;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_modinfo *psStack_70;
  secp256k1_modinv32_modinfo *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  secp256k1_modinv32_signed30 *psStack_58;
  code *pcStack_50;
  long local_40;
  long local_38;
  
  uVar19 = t->u;
  psVar35 = (secp256k1_modinv32_modinfo *)(long)(int)uVar19;
  uVar11 = t->v;
  lVar15 = (long)(int)uVar11;
  uVar20 = t->q;
  psVar14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar20;
  local_40 = (long)t->r;
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_50 = (code *)0x14b96c;
  a_00 = d;
  iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
  if (iVar1 < 1) {
    pcStack_50 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_50 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_50 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_50 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_50 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_50 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_50 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_50 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar32 = modinfo;
LAB_0014bbf7:
    pcStack_50 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_50 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_50 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14b989;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bbd4;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14b9a6;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar1 < 1) goto LAB_0014bbd9;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14b9c3;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bbde;
    psVar32 = (secp256k1_modinv32_modinfo *)-(long)psVar35;
    if (0 < (long)psVar35) {
      psVar32 = psVar35;
    }
    lVar6 = -lVar15;
    if (lVar15 < 1) {
      lVar6 = lVar15;
    }
    if (lVar6 + 0x40000000 < (long)psVar32) goto LAB_0014bbe3;
    psVar5 = (secp256k1_modinv32_signed30 *)-(long)psVar14;
    if (0 < (long)psVar14) {
      psVar5 = psVar14;
    }
    lVar6 = -local_40;
    if (local_40 < 1) {
      lVar6 = local_40;
    }
    if (lVar6 + 0x40000000 < (long)psVar5) goto LAB_0014bbe8;
    uVar26 = d->v[8] >> 0x1f;
    uVar18 = e->v[8] >> 0x1f;
    psVar21 = (secp256k1_fe *)(ulong)uVar18;
    iVar1 = (uVar18 & uVar11) + (uVar26 & uVar19);
    a_00 = (secp256k1_modinv32_signed30 *)(e->v[0] * lVar15 + (long)d->v[0] * (long)psVar35);
    lVar6 = (long)(modinfo->modulus).v[0];
    lVar9 = (long)(int)(iVar1 - ((int)a_00 * modinfo->modulus_inv30 + iVar1 & 0x3fffffff));
    piVar12 = (int32_t *)((long)a_00->v + lVar9 * lVar6);
    if (((ulong)piVar12 & 0x3fffffff) != 0) goto LAB_0014bbed;
    iVar1 = (uVar18 & (uint)local_40) + (uVar26 & uVar20);
    lVar30 = e->v[0] * local_40 + (long)d->v[0] * (long)psVar14;
    a_00 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar19 = iVar1 - (modinfo->modulus_inv30 * (int)lVar30 + iVar1 & 0x3fffffff);
    psVar21 = (secp256k1_fe *)(ulong)uVar19;
    uVar7 = lVar6 * (int)uVar19 + lVar30;
    local_38 = lVar9;
    if ((uVar7 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar6 = (long)uVar7 >> 0x1e;
    lVar30 = (long)piVar12 >> 0x1e;
    lVar23 = 1;
    do {
      lVar8 = (long)(modinfo->modulus).v[lVar23];
      lVar30 = lVar8 * lVar9 + e->v[lVar23] * lVar15 + (long)d->v[lVar23] * (long)psVar35 + lVar30;
      psVar32 = (secp256k1_modinv32_modinfo *)(e->v[lVar23] * local_40);
      lVar6 = (long)(psVar32->modulus).v +
              (long)d->v[lVar23] * (long)psVar14 + lVar6 + lVar8 * (int)uVar19;
      d->v[lVar23 + -1] = (uint)lVar30 & 0x3fffffff;
      e->v[lVar23 + -1] = (uint)lVar6 & 0x3fffffff;
      lVar23 = lVar23 + 1;
      lVar6 = lVar6 >> 0x1e;
      lVar30 = lVar30 >> 0x1e;
    } while (lVar23 != 9);
    d->v[8] = (int32_t)lVar30;
    e->v[8] = (int32_t)lVar6;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bb6d;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
    psVar14 = e;
    psVar35 = modinfo;
    if (iVar1 < 1) goto LAB_0014bbf7;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bb8a;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bbfc;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bba3;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar1 < 1) goto LAB_0014bc01;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bbbc;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_50 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar19 = a_00->v[0];
  uVar22 = (ulong)uVar19;
  uVar11 = a_00->v[3];
  uVar13 = (ulong)uVar11;
  uVar20 = a_00->v[4];
  uVar16 = (ulong)uVar20;
  uVar18 = a_00->v[5];
  uVar33 = (ulong)uVar18;
  psVar5 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_00->v[6];
  uVar26 = a_00->v[7];
  uVar7 = (ulong)uVar26;
  iStack_7c = a_00->v[8];
  lVar6 = 0;
  do {
    psStack_78 = psVar14;
    psStack_70 = psVar32;
    psStack_68 = psVar35;
    psStack_60 = e;
    psStack_58 = d;
    pcStack_50 = (code *)lVar15;
    if (a_00->v[lVar6] < -0x3fffffff) {
      pcStack_b8 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_b8 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_00->v[lVar6]) goto LAB_0014bf54;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  uStack_9c = (uint)psVar21;
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_b8 = (code *)0x14bc91;
  psVar5 = a_00;
  uStack_a8 = a_00->v[1];
  uStack_a4 = a_00->v[2];
  uStack_a0 = a_00->v[6];
  psStack_98 = b;
  iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,b,-2);
  if (iVar1 < 1) {
LAB_0014bf59:
    pcStack_b8 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_b8 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_b8 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_b8 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14bcb0;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (-1 < iVar1) goto LAB_0014bf5e;
    uVar2 = iStack_7c >> 0x1f;
    uStack_80 = psStack_98->v[1];
    uVar3 = (uVar2 & uStack_80) + uStack_a8;
    uStack_a8 = psStack_98->v[2];
    uVar10 = (uVar2 & uStack_a8) + uStack_a4;
    uStack_a4 = psStack_98->v[3];
    uStack_84 = psStack_98->v[4];
    uStack_88 = psStack_98->v[5];
    uStack_8c = psStack_98->v[6];
    uVar34 = (uVar2 & uStack_8c) + uStack_a0;
    uStack_a0 = psStack_98->v[7];
    uStack_ac = (int)uStack_9c >> 0x1f;
    uStack_9c = psStack_98->v[8];
    uVar29 = ((uVar2 & psStack_98->v[0]) + uVar19 ^ uStack_ac) - uStack_ac;
    uVar27 = ((int)uVar29 >> 0x1e) + ((uVar3 ^ uStack_ac) - uStack_ac);
    uVar3 = ((int)uVar27 >> 0x1e) + ((uVar10 ^ uStack_ac) - uStack_ac);
    uVar38 = ((int)uVar3 >> 0x1e) + (((uVar2 & uStack_a4) + uVar11 ^ uStack_ac) - uStack_ac);
    uVar11 = ((int)uVar38 >> 0x1e) + (((uVar2 & uStack_84) + uVar20 ^ uStack_ac) - uStack_ac);
    uVar19 = ((int)uVar11 >> 0x1e) + (((uVar2 & uStack_88) + uVar18 ^ uStack_ac) - uStack_ac);
    uVar20 = ((int)uVar19 >> 0x1e) + ((uVar34 ^ uStack_ac) - uStack_ac);
    uVar18 = ((int)uVar20 >> 0x1e) + (((uVar2 & uStack_a0) + uVar26 ^ uStack_ac) - uStack_ac);
    uVar31 = ((int)uVar18 >> 0x1e) + (((uVar2 & uStack_9c) + iStack_7c ^ uStack_ac) - uStack_ac);
    uVar33 = (ulong)uVar31;
    uStack_b0 = (int)uVar31 >> 0x1f;
    uVar34 = (psStack_98->v[0] & uStack_b0) + (uVar29 & 0x3fffffff);
    uVar10 = (uStack_88 & uStack_b0) + (uVar19 & 0x3fffffff);
    uVar22 = (ulong)uVar10;
    uVar29 = (uStack_8c & uStack_b0) + (uVar20 & 0x3fffffff);
    uVar13 = (ulong)uVar29;
    uVar19 = ((int)uVar34 >> 0x1e) + (uStack_80 & uStack_b0) + (uVar27 & 0x3fffffff);
    uVar20 = ((int)uVar19 >> 0x1e) + (uStack_a8 & uStack_b0) + (uVar3 & 0x3fffffff);
    uVar26 = ((int)uVar20 >> 0x1e) + (uStack_a4 & uStack_b0) + (uVar38 & 0x3fffffff);
    uVar2 = ((int)uVar26 >> 0x1e) + (uStack_84 & uStack_b0) + (uVar11 & 0x3fffffff);
    uVar10 = ((int)uVar2 >> 0x1e) + uVar10;
    uVar29 = ((int)uVar10 >> 0x1e) + uVar29;
    uVar11 = ((int)uVar29 >> 0x1e) + (uStack_a0 & uStack_b0) + (uVar18 & 0x3fffffff);
    uVar18 = ((int)uVar11 >> 0x1e) + (uStack_9c & uStack_b0) + uVar31;
    uVar16 = (ulong)uVar18;
    uVar26 = uVar26 & 0x3fffffff;
    psVar21 = (secp256k1_fe *)(ulong)uVar26;
    uVar2 = uVar2 & 0x3fffffff;
    psVar5 = (secp256k1_modinv32_signed30 *)(ulong)uVar2;
    uVar11 = uVar11 & 0x3fffffff;
    uVar7 = (ulong)uVar11;
    a_00->v[0] = uVar34 & 0x3fffffff;
    a_00->v[1] = uVar19 & 0x3fffffff;
    a_00->v[2] = uVar20 & 0x3fffffff;
    a_00->v[3] = uVar26;
    a_00->v[4] = uVar2;
    a_00->v[5] = uVar10 & 0x3fffffff;
    a_00->v[6] = uVar29 & 0x3fffffff;
    a_00->v[7] = uVar11;
    a_00->v[8] = uVar18;
    if (0x3fffffff < uVar18) goto LAB_0014bf63;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14bf21;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,0);
    if (iVar1 < 0) goto LAB_0014bf68;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14bf3c;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_b8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_150 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    psStack_150 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_1a0 = (code *)0x14bfa9;
  uStack_e0 = uVar7;
  uStack_d8 = uVar33;
  uStack_d0 = uVar13;
  psStack_c8 = a_00;
  uStack_c0 = uVar22;
  pcStack_b8 = (code *)uVar16;
  (*(code *)psStack_150)(&sStack_188);
  if (psVar5 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar5->v + 8) = sStack_188.n[4];
    *(ulong *)(psVar5[1].v + 1) = CONCAT44(sStack_188.normalized,sStack_188.magnitude);
    *(uint64_t *)(psVar5->v + 4) = sStack_188.n[2];
    *(uint64_t *)(psVar5->v + 6) = sStack_188.n[3];
    *(uint64_t *)psVar5->v = sStack_188.n[0];
    *(uint64_t *)(psVar5->v + 2) = sStack_188.n[1];
  }
  uVar39 = 0xfffffffffffff;
  uVar36 = 0xf000000000000;
  uVar16 = 0xffffffffffff;
  uVar33 = 0x1000003d0;
  sStack_118.n[0] = psVar21->n[0];
  sStack_118.n[1] = psVar21->n[1];
  sStack_118.n[2] = psVar21->n[2];
  sStack_118.n[3] = psVar21->n[3];
  sStack_118.n[4] = psVar21->n[4];
  sStack_118.magnitude = psVar21->magnitude;
  sStack_118.normalized = psVar21->normalized;
  a_01 = &sStack_118;
  pcStack_1a0 = (code *)0x14c020;
  secp256k1_fe_verify(a_01);
  lStack_190 = 0x1000003d1;
  uVar7 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
  if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
    uVar13 = (uVar7 >> 0x34) + sStack_118.n[1];
    uVar22 = (uVar13 >> 0x34) + sStack_118.n[2];
    uVar24 = (uVar22 >> 0x34) + sStack_118.n[3];
    uVar28 = (uVar24 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
    if ((((uVar13 | uVar7 | uVar22 | uVar24) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
       (((uVar7 | 0x1000003d0) & uVar13 & uVar22 & uVar24 & (uVar28 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar21 = &sStack_188;
    pcStack_1a0 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar21);
    uVar16 = uVar16 & sStack_188.n[4];
    uVar7 = (sStack_188.n[4] >> 0x30) * lStack_190 + sStack_188.n[0];
    uVar13 = (uVar7 >> 0x34) + sStack_188.n[1];
    uVar22 = (uVar13 >> 0x34) + sStack_188.n[2];
    r = (secp256k1_fe *)((uVar22 >> 0x34) + sStack_188.n[3]);
    uVar24 = ((ulong)r >> 0x34) + uVar16;
    if ((((uVar13 | uVar7 | uVar22 | (ulong)r) & uVar39) == 0 && uVar24 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar24 ^ uVar36),
       ((uVar7 ^ uVar33) & uVar13 & uVar22 & (ulong)r & (ulong)r_00) == uVar39)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_1a0 = (code *)0x14c0db;
    r = psVar21;
    secp256k1_fe_mul(&sStack_118,psVar21,&sStack_188);
    pcStack_1a0 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_118);
    r_00 = &fe_minus_one;
    pcStack_1a0 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_118.magnitude < 0x20) {
      sStack_118.n[0] = sStack_118.n[0] + 0xffffefffffc2e;
      sStack_118.n[1] = sStack_118.n[1] + 0xfffffffffffff;
      sStack_118.n[2] = sStack_118.n[2] + 0xfffffffffffff;
      sStack_118.n[3] = sStack_118.n[3] + 0xfffffffffffff;
      sStack_118.n[4] = sStack_118.n[4] + 0xffffffffffff;
      sStack_118.normalized = 0;
      sStack_118.magnitude = sStack_118.magnitude + 1;
      pcStack_1a0 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_118);
      pcStack_1a0 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_118);
      uVar7 = (sStack_118.n[4] >> 0x30) * lStack_190 + sStack_118.n[0];
      uVar16 = (uVar7 >> 0x34) + sStack_118.n[1];
      uVar13 = (uVar16 >> 0x34) + sStack_118.n[2];
      r = (secp256k1_fe *)((uVar13 >> 0x34) + sStack_118.n[3]);
      uVar22 = ((ulong)r >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
      if ((((uVar16 | uVar7 | uVar13 | (ulong)r) & 0xfffffffffffff) != 0 || uVar22 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar22 ^ 0xf000000000000),
         ((uVar7 ^ 0x1000003d0) & uVar16 & uVar13 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_148.n[0] = psVar21->n[0];
      sStack_148.n[1] = psVar21->n[1];
      sStack_148.n[2] = psVar21->n[2];
      sStack_148.n[3] = psVar21->n[3];
      sStack_148.n[4] = psVar21->n[4];
      sStack_148.magnitude = psVar21->magnitude;
      sStack_148.normalized = psVar21->normalized;
      psVar21 = &sStack_148;
      pcStack_1a0 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar21);
      r_00 = &fe_minus_one;
      pcStack_1a0 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_148.magnitude) goto LAB_0014c56a;
      uVar17 = sStack_148.n[0] + 0xffffefffffc2e;
      uVar37 = sStack_148.n[1] + 0xfffffffffffff;
      uVar39 = sStack_148.n[2] + 0xfffffffffffff;
      uVar36 = sStack_148.n[3] + 0xfffffffffffff;
      uVar33 = sStack_148.n[4] + 0xffffffffffff;
      sStack_148.normalized = 0;
      sStack_148.magnitude = sStack_148.magnitude + 1;
      pcStack_1a0 = (code *)0x14c265;
      sStack_148.n[0] = uVar17;
      sStack_148.n[1] = uVar37;
      sStack_148.n[2] = uVar39;
      sStack_148.n[3] = uVar36;
      sStack_148.n[4] = uVar33;
      secp256k1_fe_verify(&sStack_148);
      pcStack_1a0 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_148);
      a_01 = psStack_150;
      uVar7 = (uVar33 >> 0x30) * lStack_190 + uVar17;
      if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
        uVar33 = uVar33 & 0xffffffffffff;
        uVar24 = uVar37 + (uVar7 >> 0x34);
        uVar16 = (uVar24 >> 0x34) + uVar39;
        uVar13 = (uVar16 >> 0x34) + uVar36;
        uVar22 = (uVar13 >> 0x34) + uVar33;
        if (((uVar24 | uVar7 | uVar16 | uVar13) & 0xfffffffffffff) == 0 && uVar22 == 0) {
          return;
        }
        if (((uVar7 | 0x1000003d0) & uVar24 & uVar16 & uVar13 & (uVar22 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_148;
      pcStack_1a0 = (code *)0x14c32d;
      (*(code *)psStack_150)();
      psVar21 = &sStack_188;
      pcStack_1a0 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar21);
      r_00 = &fe_minus_one;
      pcStack_1a0 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_188.magnitude) goto LAB_0014c56f;
      psVar21 = &sStack_188;
      sStack_188.n[0] = sStack_188.n[0] + 0xffffefffffc2e;
      sStack_188.n[1] = sStack_188.n[1] + 0xfffffffffffff;
      sStack_188.n[2] = sStack_188.n[2] + 0xfffffffffffff;
      sStack_188.n[3] = sStack_188.n[3] + 0xfffffffffffff;
      sStack_188.n[4] = sStack_188.n[4] + 0xffffffffffff;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      uVar16 = 0;
      sStack_188.normalized = 0;
      pcStack_1a0 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar21);
      pcStack_1a0 = (code *)0x14c398;
      r = psVar21;
      (*(code *)a_01)(psVar21);
      pcStack_1a0 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar21);
      sStack_188.n[0] = sStack_188.n[0] + 1;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      sStack_188.normalized = 0;
      pcStack_1a0 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar21);
      pcStack_1a0 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar21);
      a_01 = &sStack_148;
      pcStack_1a0 = (code *)0x14c3c6;
      r_00 = a_01;
      secp256k1_fe_verify(a_01);
      if (sStack_148.magnitude + sStack_188.magnitude < 0x21) {
        sStack_188.n[0] = sStack_188.n[0] + sStack_148.n[0];
        sStack_188.n[1] = sStack_188.n[1] + sStack_148.n[1];
        sStack_188.n[2] = sStack_188.n[2] + sStack_148.n[2];
        sStack_188.n[3] = sStack_188.n[3] + sStack_148.n[3];
        sStack_188.n[4] = sStack_188.n[4] + sStack_148.n[4];
        sStack_188.normalized = 0;
        pcStack_1a0 = (code *)0x14c414;
        sStack_188.magnitude = sStack_148.magnitude + sStack_188.magnitude;
        secp256k1_fe_verify(&sStack_188);
        pcStack_1a0 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_188);
        uVar7 = (sStack_188.n[4] >> 0x30) * lStack_190 + sStack_188.n[0];
        if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
          uVar13 = (uVar7 >> 0x34) + sStack_188.n[1];
          uVar22 = (uVar13 >> 0x34) + sStack_188.n[2];
          uVar24 = (uVar22 >> 0x34) + sStack_188.n[3];
          uVar28 = (uVar24 >> 0x34) + (sStack_188.n[4] & 0xffffffffffff);
          if (((uVar13 | uVar7 | uVar22 | uVar24) & 0xfffffffffffff) == 0 && uVar28 == 0) {
            return;
          }
          if (((uVar7 | 0x1000003d0) & uVar13 & uVar22 & uVar24 & (uVar28 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1a0 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_1a0 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_1a0 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_01 = &sStack_118;
      pcStack_1a0 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar16 = 0xffffffffffff;
      pcStack_1a0 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_1a0 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_1a0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar25 = (secp256k1_fe *)auStack_210;
  pcVar40 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar40 = secp256k1_scalar_inverse;
  }
  pcStack_218 = (code *)0x14c5a7;
  auStack_1d0._32_8_ = psVar21;
  auStack_1d0._40_8_ = a_01;
  pcStack_1a0 = (code *)uVar39;
  (*pcVar40)(auStack_210);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_210._20_4_,auStack_210._16_4_);
    r_00->n[3] = CONCAT44(auStack_210._28_4_,auStack_210._24_4_);
    r_00->n[0] = CONCAT44(auStack_210._4_4_,auStack_210._0_4_);
    r_00->n[1] = CONCAT44(auStack_210._12_4_,auStack_210._8_4_);
  }
  pcStack_218 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar41._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar41._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar41._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar41._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar41);
  if (iVar1 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_1d0;
    pcStack_218 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_210);
    pcStack_218 = (code *)0x14c602;
    psVar21 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_1d0._0_8_ != 1 || auStack_1d0._8_8_ != 0) || auStack_1d0._16_8_ != 0) ||
        auStack_1d0._24_8_ != 0) {
      pcStack_218 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_218 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_210 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_218 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_210 + 0x20));
    auVar42._0_4_ = -(uint)(iStack_1e0 == 0 && auStack_210._32_4_ == 0);
    auVar42._4_4_ = -(uint)(iStack_1dc == 0 && iStack_1ec == 0);
    auVar42._8_4_ = -(uint)(iStack_1d8 == 0 && iStack_1e8 == 0);
    auVar42._12_4_ = -(uint)(iStack_1d4 == 0 && iStack_1e4 == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar42);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_210 + 0x20);
    pcStack_218 = (code *)0x14c66b;
    (*pcVar40)(a,a);
    pcStack_218 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_210,&scalar_minus_one,(secp256k1_scalar *)auStack_210);
    pcStack_218 = (code *)0x14c689;
    (*pcVar40)(auStack_210,auStack_210);
    pcStack_218 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_210,(secp256k1_scalar *)auStack_210,&secp256k1_scalar_one
              );
    pcStack_218 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_210,a,(secp256k1_scalar *)auStack_210);
    pcStack_218 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_210);
    auVar43._0_4_ = -(uint)(auStack_210._16_4_ == 0 && auStack_210._0_4_ == 0);
    auVar43._4_4_ = -(uint)(auStack_210._20_4_ == 0 && auStack_210._4_4_ == 0);
    auVar43._8_4_ = -(uint)(auStack_210._24_4_ == 0 && auStack_210._8_4_ == 0);
    auVar43._12_4_ = -(uint)(auStack_210._28_4_ == 0 && auStack_210._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar43);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_218 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_210;
  }
  pcStack_218 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_210);
  auVar44._0_4_ = -(uint)(auStack_210._16_4_ == 0 && auStack_210._0_4_ == 0);
  auVar44._4_4_ = -(uint)(auStack_210._20_4_ == 0 && auStack_210._4_4_ == 0);
  auVar44._8_4_ = -(uint)(auStack_210._24_4_ == 0 && auStack_210._8_4_ == 0);
  auVar44._12_4_ = -(uint)(auStack_210._28_4_ == 0 && auStack_210._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar44);
  r = (secp256k1_fe *)auStack_210;
  psVar21 = psVar25;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_218 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_12c8;
  psStack_240 = r;
  uStack_238 = uVar33;
  uStack_230 = uVar36;
  psStack_228 = r_00;
  pcStack_220 = pcVar40;
  pcStack_218 = (code *)uVar16;
  memset(__s,0,0x1081);
  uStack_12d8 = 0;
  lVar15 = 0x41;
  psStack_12d0 = psVar21;
  secp256k1_hsort(__s,0x41,(size_t)psVar21,test_hsort_cmp,&uStack_12d8);
  if (0x3f < uStack_12d8) {
    test_hsort_is_sorted(auStack_12c8,0x41,(size_t)psVar21);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_12c8,count * (long)psVar21);
        secp256k1_hsort(auStack_12c8,count,(size_t)psVar21,test_hsort_cmp,&uStack_12d8);
        test_hsort_is_sorted(auStack_12c8,count,(size_t)psVar21);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar6 = 0;
    do {
      if (__s[lVar6] != *(uchar *)(lVar15 + lVar6)) {
        return;
      }
      lVar6 = lVar6 + 1;
    } while (extraout_RDX[1] != lVar6);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}